

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdWin.c
# Opt level: O0

int Sbd_ManCollectConstants
              (sat_solver *pSat,int *nCareMints,int PivotVar,word **pVarSims,Vec_Int_t *vInds)

{
  int iVar1;
  int iVar2;
  int local_54;
  lit local_50;
  int iLit;
  int k;
  int status;
  int fOffSet;
  int Ind;
  int i;
  int nBTLimit;
  Vec_Int_t *vInds_local;
  word **pVarSims_local;
  int *piStack_20;
  int PivotVar_local;
  int *nCareMints_local;
  sat_solver *pSat_local;
  
  Ind = 0;
  _i = vInds;
  vInds_local = (Vec_Int_t *)pVarSims;
  pVarSims_local._4_4_ = PivotVar;
  piStack_20 = nCareMints;
  nCareMints_local = &pSat->size;
  iVar1 = Vec_IntSize(vInds);
  if (iVar1 != *piStack_20 + piStack_20[1]) {
    __assert_fail("Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1]",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdWin.c"
                  ,0x19f,
                  "int Sbd_ManCollectConstants(sat_solver *, int *, int, word **, Vec_Int_t *)");
  }
  fOffSet = 0;
  while( true ) {
    iVar1 = fOffSet;
    iVar2 = Vec_IntSize(_i);
    if (iVar2 <= iVar1) {
      return -1;
    }
    status = Vec_IntEntry(_i,fOffSet);
    k = (int)(fOffSet < *piStack_20);
    local_54 = Abc_Var2Lit(pVarSims_local._4_4_,k);
    sat_solver_random_polarity((sat_solver *)nCareMints_local);
    iLit = sat_solver_solve((sat_solver *)nCareMints_local,&local_54,&local_50,(long)Ind,0,0,0);
    if (iLit == 0) break;
    if (iLit == -1) {
      return k;
    }
    for (local_50 = 0; local_50 <= pVarSims_local._4_4_; local_50 = local_50 + 1) {
      iVar1 = Abc_TtGetBit(*(word **)(&vInds_local->nCap + (long)local_50 * 2),status);
      iVar2 = sat_solver_var_value((sat_solver *)nCareMints_local,local_50);
      if (iVar1 != iVar2) {
        Abc_TtXorBit(*(word **)(&vInds_local->nCap + (long)local_50 * 2),status);
      }
    }
    fOffSet = fOffSet + 1;
  }
  return -2;
}

Assistant:

int Sbd_ManCollectConstants( sat_solver * pSat, int nCareMints[2], int PivotVar, word * pVarSims[], Vec_Int_t * vInds )
{
    int nBTLimit = 0;
    int i, Ind; 
    assert( Vec_IntSize(vInds) == nCareMints[0] + nCareMints[1] );
    Vec_IntForEachEntry( vInds, Ind, i )
    {
        int fOffSet = (int)(i < nCareMints[0]);
        int status, k, iLit = Abc_Var2Lit( PivotVar, fOffSet );
        sat_solver_random_polarity( pSat );
        status = sat_solver_solve( pSat, &iLit, &iLit + 1, nBTLimit, 0, 0, 0 );
        if ( status == l_Undef )
            return -2;
        if ( status == l_False )
            return fOffSet;
        for ( k = 0; k <= PivotVar; k++ )
            if ( Abc_TtGetBit(pVarSims[k], Ind) != sat_solver_var_value(pSat, k) )
                Abc_TtXorBit(pVarSims[k], Ind);
    }
    return -1;
}